

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O1

void la_daxpy_oe(int n,double alpha,double *x,int incx,double *y,int incy,double *z,int incz)

{
  ulong uVar1;
  
  if (x == (double *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x4f,
                  "void la_daxpy_oe(int, double, const double *, int, const double *, int, double *, int)"
                 );
  }
  if (y != (double *)0x0) {
    if (z != (double *)0x0) {
      if (0 < n) {
        uVar1 = (ulong)(uint)n;
        do {
          *z = *x * alpha + *y;
          z = z + incz;
          y = y + incy;
          x = x + incx;
          uVar1 = uVar1 - 1;
        } while (uVar1 != 0);
      }
      return;
    }
    __assert_fail("z",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x51,
                  "void la_daxpy_oe(int, double, const double *, int, const double *, int, double *, int)"
                 );
  }
  __assert_fail("y",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,0x50,
                "void la_daxpy_oe(int, double, const double *, int, const double *, int, double *, int)"
               );
}

Assistant:

void la_daxpy_oe(
        int n,
        double alpha,
        const double *x, int incx,
        const double *y, int incy,
        double *z, int incz)
{
    assert(x);
    assert(y);
    assert(z);

    for (int i = 0; i < n; i++) {
        z[i * incz] = alpha * x[i * incx] + y[i * incy];
    }
}